

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.cpp
# Opt level: O0

void __thiscall wasm::FuzzParams::setDefaults(FuzzParams *this)

{
  FuzzParams *this_local;
  
  this->MAX_PARAMS = 10;
  this->MAX_VARS = 0x14;
  this->MAX_GLOBALS = 0x1e;
  this->MAX_TUPLE_SIZE = 6;
  this->MAX_STRUCT_SIZE = 6;
  this->MAX_ARRAY_SIZE = 100;
  this->MIN_HEAPTYPES = 4;
  this->MAX_HEAPTYPES = 0x14;
  this->TRIES = 10;
  this->NESTING_LIMIT = 0xb;
  this->BLOCK_FACTOR = 5;
  Address::operator=(&this->USABLE_MEMORY,0x10);
  this->HANG_LIMIT = 100;
  this->MAX_NEW_GC_TYPES = 0x19;
  this->MAX_TRY_CATCHES = 4;
  return;
}

Assistant:

void FuzzParams::setDefaults() {
  MAX_PARAMS = 10;

  MAX_VARS = 20;

  MAX_GLOBALS = 30;

  MAX_TUPLE_SIZE = 6;

  MAX_STRUCT_SIZE = 6;

  MAX_ARRAY_SIZE = 100;

  MIN_HEAPTYPES = 4;
  MAX_HEAPTYPES = 20;

  TRIES = 10;

  NESTING_LIMIT = 11;

  BLOCK_FACTOR = 5;

  USABLE_MEMORY = 16;

  HANG_LIMIT = 100;

  MAX_NEW_GC_TYPES = 25;

  MAX_TRY_CATCHES = 4;
}